

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_bfext_reg(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 ret;
  uint16_t uVar1;
  TCGv_i32 ret_00;
  TCGv_i32 pTVar2;
  uint uVar3;
  uint uVar4;
  uintptr_t o_1;
  uint arg2;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = read_im16(env,s);
  pTVar2 = tcg_ctx->cpu_dregs[insn & 7];
  ret = *(TCGv_i32 *)((long)tcg_ctx->cpu_dregs + (ulong)(uVar1 >> 9 & 0x38));
  uVar3 = (uint)(uVar1 >> 6);
  arg2 = uVar3 & 0x1f;
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  if ((uVar1 & 0x20) != 0) {
    if ((uVar1 >> 0xb & 1) == 0) {
      tcg_gen_rotli_i32_m68k(tcg_ctx,ret_00,pTVar2,arg2);
    }
    else {
      tcg_gen_andi_i32_m68k(tcg_ctx,ret_00,tcg_ctx->cpu_dregs[uVar3 & 7],0x1f);
      tcg_gen_rotl_i32_m68k(tcg_ctx,ret_00,pTVar2,ret_00);
    }
    pTVar2 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_neg_i32(tcg_ctx,pTVar2,tcg_ctx->cpu_dregs[uVar1 & 7]);
    tcg_gen_andi_i32_m68k(tcg_ctx,pTVar2,pTVar2,0x1f);
    tcg_gen_op3_m68k(tcg_ctx,INDEX_op_sar_i32,(TCGArg)(QREG_CC_N + (long)tcg_ctx),
                     (TCGArg)(ret_00 + (long)&tcg_ctx->pool_cur),
                     (TCGArg)(pTVar2 + (long)&tcg_ctx->pool_cur));
    if ((insn >> 9 & 1) == 0) {
      tcg_gen_shr_i32(tcg_ctx,ret,ret_00,pTVar2);
    }
    else {
      tcg_gen_mov_i32(tcg_ctx,ret,QREG_CC_N);
    }
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar2 + (long)&tcg_ctx->pool_cur));
    goto LAB_0067b985;
  }
  uVar4 = uVar1 - 1 & 0x1f;
  if ((uVar1 >> 0xb & 1) == 0) {
    uVar3 = uVar4 + arg2 + 1;
    if (0x20 < uVar3) {
      tcg_gen_rotli_i32_m68k(tcg_ctx,ret_00,pTVar2,arg2);
      goto LAB_0067b865;
    }
    uVar3 = 0x20 - uVar3;
  }
  else {
    tcg_gen_andi_i32_m68k(tcg_ctx,ret_00,tcg_ctx->cpu_dregs[uVar3 & 7],0x1f);
    tcg_gen_rotl_i32_m68k(tcg_ctx,ret_00,pTVar2,ret_00);
LAB_0067b865:
    uVar3 = uVar4 ^ 0x1f;
    pTVar2 = ret_00;
  }
  tcg_gen_sextract_i32_m68k(tcg_ctx,QREG_CC_N,pTVar2,uVar3,uVar4 + 1);
  if ((insn >> 9 & 1) == 0) {
    tcg_gen_extract_i32_m68k(tcg_ctx,ret,pTVar2,uVar3,uVar4 + 1);
  }
  else {
    tcg_gen_mov_i32(tcg_ctx,ret,QREG_CC_N);
  }
LAB_0067b985:
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  set_cc_op(s,CC_OP_LOGIC);
  return;
}

Assistant:

DISAS_INSN(bfext_reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int ext = read_im16(env, s);
    int is_sign = insn & 0x200;
    TCGv src = DREG(insn, 0);
    TCGv dst = DREG(ext, 12);
    int len = ((extract32(ext, 0, 5) - 1) & 31) + 1;
    int ofs = extract32(ext, 6, 5);  /* big bit-endian */
    int pos = 32 - ofs - len;        /* little bit-endian */
    TCGv tmp = tcg_temp_new(tcg_ctx);
    TCGv shift;

    /*
     * In general, we're going to rotate the field so that it's at the
     * top of the word and then right-shift by the complement of the
     * width to extend the field.
     */
    if (ext & 0x20) {
        /* Variable width.  */
        if (ext & 0x800) {
            /* Variable offset.  */
            tcg_gen_andi_i32(tcg_ctx, tmp, DREG(ext, 6), 31);
            tcg_gen_rotl_i32(tcg_ctx, tmp, src, tmp);
        } else {
            tcg_gen_rotli_i32(tcg_ctx, tmp, src, ofs);
        }

        shift = tcg_temp_new(tcg_ctx);
        tcg_gen_neg_i32(tcg_ctx, shift, DREG(ext, 0));
        tcg_gen_andi_i32(tcg_ctx, shift, shift, 31);
        tcg_gen_sar_i32(tcg_ctx, QREG_CC_N, tmp, shift);
        if (is_sign) {
            tcg_gen_mov_i32(tcg_ctx, dst, QREG_CC_N);
        } else {
            tcg_gen_shr_i32(tcg_ctx, dst, tmp, shift);
        }
        tcg_temp_free(tcg_ctx, shift);
    } else {
        /* Immediate width.  */
        if (ext & 0x800) {
            /* Variable offset */
            tcg_gen_andi_i32(tcg_ctx, tmp, DREG(ext, 6), 31);
            tcg_gen_rotl_i32(tcg_ctx, tmp, src, tmp);
            src = tmp;
            pos = 32 - len;
        } else {
            /*
             * Immediate offset.  If the field doesn't wrap around the
             * end of the word, rely on (s)extract completely.
             */
            if (pos < 0) {
                tcg_gen_rotli_i32(tcg_ctx, tmp, src, ofs);
                src = tmp;
                pos = 32 - len;
            }
        }

        tcg_gen_sextract_i32(tcg_ctx, QREG_CC_N, src, pos, len);
        if (is_sign) {
            tcg_gen_mov_i32(tcg_ctx, dst, QREG_CC_N);
        } else {
            tcg_gen_extract_i32(tcg_ctx, dst, src, pos, len);
        }
    }

    tcg_temp_free(tcg_ctx, tmp);
    set_cc_op(s, CC_OP_LOGIC);
}